

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O1

bool __thiscall flexbuffers::Reference::MutateFloat(Reference *this,float f)

{
  byte bVar1;
  ulong *puVar2;
  ulong uVar3;
  
  if (this->type_ == FBT_INDIRECT_FLOAT) {
    puVar2 = (ulong *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        uVar3 = (ulong)(byte)*puVar2;
      }
      else {
        uVar3 = (ulong)(ushort)*puVar2;
      }
    }
    else if (bVar1 < 8) {
      uVar3 = (ulong)(uint)*puVar2;
    }
    else {
      uVar3 = *puVar2;
    }
    if (this->byte_width_ == '\x04') {
      *(float *)((long)puVar2 + -uVar3) = f;
    }
    else {
      if (this->byte_width_ != '\b') goto LAB_0015fda6;
      *(double *)((long)puVar2 + -uVar3) = (double)f;
    }
  }
  else {
    if (this->type_ != FBT_FLOAT) {
      return false;
    }
    if (this->parent_width_ == '\x04') {
      *(float *)this->data_ = f;
    }
    else {
      if (this->parent_width_ != '\b') {
LAB_0015fda6:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                      ,0x332,
                      "bool flexbuffers::Reference::MutateF(const uint8_t *, T, size_t, BitWidth) [T = float]"
                     );
      }
      *(double *)this->data_ = (double)f;
    }
  }
  return true;
}

Assistant:

bool MutateFloat(float f) {
    if (type_ == FBT_FLOAT) {
      return MutateF(data_, f, parent_width_, BIT_WIDTH_32);
    } else if (type_ == FBT_INDIRECT_FLOAT) {
      return MutateF(Indirect(), f, byte_width_, BIT_WIDTH_32);
    } else {
      return false;
    }
  }